

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qflags.h
# Opt level: O2

void __thiscall QMainWindowLayout::setDockOptions(QMainWindowLayout *this,DockOptions opts)

{
  if ((QFlagsStorageHelper<QMainWindow::DockOption,_4>)*(Int *)(this + 0x700) ==
      (QFlagsStorage<QMainWindow::DockOption>)
      opts.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
      super_QFlagsStorage<QMainWindow::DockOption>.i) {
    return;
  }
  *(QFlagsStorageHelper<QMainWindow::DockOption,_4> *)(this + 0x700) =
       opts.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
       super_QFlagsStorage<QMainWindow::DockOption>.i;
  setVerticalTabsEnabled
            (this,SUB41(((uint)opts.super_QFlagsStorageHelper<QMainWindow::DockOption,_4>.
                               super_QFlagsStorage<QMainWindow::DockOption>.i & 0x10) >> 4,0));
  (**(code **)(*(long *)this + 0x70))(this);
  return;
}

Assistant:

constexpr inline bool operator==(QFlags lhs, QFlags rhs) noexcept
    { return lhs.i == rhs.i; }